

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O2

void sha256_Final(SHA256_CTX *context,sha2_byte *digest)

{
  uint32_t *data;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int j;
  uint uVar4;
  long lVar5;
  uint uVar6;
  
  if (digest != (sha2_byte *)0x0) {
    uVar6 = (uint)context->bitcount >> 3 & 0x3f;
    data = context->buffer;
    uVar4 = uVar6 + 1;
    *(undefined1 *)((long)context->buffer + (ulong)uVar6) = 0x80;
    if (0x37 < uVar6) {
      memzero((void *)((ulong)uVar4 + (long)data),(ulong)(uVar6 ^ 0x3f));
      for (lVar5 = 10; lVar5 != 0x1a; lVar5 = lVar5 + 1) {
        uVar4 = context->state[lVar5];
        context->state[lVar5] =
             uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      }
      sha256_Transform(context->state,data,context->state);
      uVar4 = 0;
    }
    memzero((void *)((ulong)uVar4 + (long)data),(ulong)(0x38 - uVar4));
    for (lVar5 = 10; lVar5 != 0x18; lVar5 = lVar5 + 1) {
      uVar4 = context->state[lVar5];
      context->state[lVar5] =
           uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    }
    *(uint64_t *)(context->buffer + 0xe) = context->bitcount >> 0x20 | context->bitcount << 0x20;
    sha256_Transform(context->state,data,context->state);
    for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
      uVar4 = context->state[lVar5];
      context->state[lVar5] =
           uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    }
    uVar1 = *(undefined8 *)context->state;
    uVar2 = *(undefined8 *)(context->state + 2);
    uVar3 = *(undefined8 *)(context->state + 6);
    *(undefined8 *)(digest + 0x10) = *(undefined8 *)(context->state + 4);
    *(undefined8 *)(digest + 0x18) = uVar3;
    *(undefined8 *)digest = uVar1;
    *(undefined8 *)(digest + 8) = uVar2;
  }
  memzero(context,0x68);
  return;
}

Assistant:

void sha256_Final(trezor::SHA256_CTX* context, sha2_byte digest[]) {
	unsigned int	usedspace;

	/* If no digest buffer is passed, we don't bother doing this: */
	if (digest != (sha2_byte*)0) {
		usedspace = (context->bitcount >> 3) % SHA256_BLOCK_LENGTH;
		/* Begin padding with a 1 bit: */
		((uint8_t*)context->buffer)[usedspace++] = 0x80;
		
		if (usedspace > SHA256_SHORT_BLOCK_LENGTH) {
			memzero(((uint8_t*)context->buffer) + usedspace, SHA256_BLOCK_LENGTH - usedspace);

#if BYTE_ORDER == LITTLE_ENDIAN
			/* Convert TO host byte order */
			for (int j = 0; j < 16; j++) {
				REVERSE32(context->buffer[j],context->buffer[j]);
			}
#endif
			/* Do second-to-last transform: */
			sha256_Transform(context->state, context->buffer, context->state);
			
			/* And prepare the last transform: */
			usedspace = 0;
		}
		/* Set-up for the last transform: */
		memzero(((uint8_t*)context->buffer) + usedspace, SHA256_SHORT_BLOCK_LENGTH - usedspace);

#if BYTE_ORDER == LITTLE_ENDIAN
		/* Convert TO host byte order */
		for (int j = 0; j < 14; j++) {
			REVERSE32(context->buffer[j],context->buffer[j]);
		}
#endif
		/* Set the bit count: */
		context->buffer[14] = context->bitcount >> 32;
		context->buffer[15] = context->bitcount & 0xffffffff;

		/* Final transform: */
		sha256_Transform(context->state, context->buffer, context->state);

#if BYTE_ORDER == LITTLE_ENDIAN
		/* Convert FROM host byte order */
		for (int j = 0; j < 8; j++) {
			REVERSE32(context->state[j],context->state[j]);
		}
#endif
		MEMCPY_BCOPY(digest, context->state, SHA256_DIGEST_LENGTH);
	}

	/* Clean up state data: */
	memzero(context, sizeof(trezor::SHA256_CTX));
}